

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O0

void __thiscall LinearScan::AddToActive(LinearScan *this,Lifetime *lifetime)

{
  code *pcVar1;
  BOOLEAN BVar2;
  bool bVar3;
  undefined4 *puVar4;
  Lifetime *lifetime_local;
  LinearScan *this_local;
  
  AddLiveRange(this->activeLiveranges,lifetime);
  this->regContent[lifetime->reg] = lifetime;
  if ((*(ushort *)&lifetime->field_0x9c >> 9 & 1) == 0) {
    BVar2 = BVUnitT<unsigned_long>::Test(&this->secondChanceRegs,(uint)lifetime->reg);
    if (BVar2 != '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x2bf,"(!this->secondChanceRegs.Test(lifetime->reg))",
                         "!this->secondChanceRegs.Test(lifetime->reg)");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  else {
    BVUnitT<unsigned_long>::Set(&this->secondChanceRegs,(uint)lifetime->reg);
  }
  return;
}

Assistant:

void
LinearScan::AddToActive(Lifetime * lifetime)
{
    LinearScan::AddLiveRange(this->activeLiveranges, lifetime);
    this->regContent[lifetime->reg] = lifetime;
    if (lifetime->isSecondChanceAllocated)
    {
        this->secondChanceRegs.Set(lifetime->reg);
    }
    else
    {
        Assert(!this->secondChanceRegs.Test(lifetime->reg));
    }
}